

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

string_view __thiscall chain::str::trim_right_view(str *this,string_view data)

{
  string_view sVar1;
  size_type __n;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t local_40;
  char *local_38;
  size_type local_30;
  int64_t index;
  string_view data_local;
  
  data_local._M_len = data._M_len;
  index = (int64_t)this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&index);
  if (!bVar2) {
    local_30 = std::basic_string_view<char,_std::char_traits<char>_>::length
                         ((basic_string_view<char,_std::char_traits<char>_> *)&index);
    do {
      __n = local_30;
      local_30 = __n - 1;
      if ((long)local_30 < 0) break;
      pbVar4 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&index,
                                  local_30);
      iVar3 = isspace((uint)*pbVar4);
    } while (iVar3 != 0);
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&index,0,__n);
    local_40 = bVar5._M_len;
    index = local_40;
    local_38 = bVar5._M_str;
    data_local._M_len = (size_t)local_38;
  }
  sVar1._M_str = (char *)data_local._M_len;
  sVar1._M_len = index;
  return sVar1;
}

Assistant:

auto trim_right_view(std::string_view data) -> std::string_view
{
    if (!data.empty())
    {
        int64_t index = static_cast<int64_t>(data.length() - 1);
        while (index >= 0)
        {
            if (!std::isspace(static_cast<unsigned char>(data[static_cast<std::size_t>(index)])))
            {
                break;
            }
            else
            {
                --index;
            }
        }

        data = data.substr(0, static_cast<std::size_t>(index + 1));
    }

    return data;
}